

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileGate.cpp
# Opt level: O0

State __thiscall
TileGate::_findNextStateOR
          (TileGate *this,State *adjacentStates,int numInputs,int numHigh,int numMiddle)

{
  int numMiddle_local;
  int numHigh_local;
  int numInputs_local;
  State *adjacentStates_local;
  TileGate *this_local;
  
  if (1 < numInputs) {
    if (0 < numHigh) {
      return HIGH;
    }
    if (0 < numMiddle) {
      return MIDDLE;
    }
  }
  return LOW;
}

Assistant:

State TileGate::_findNextStateOR(State adjacentStates[4], int numInputs, int numHigh, int numMiddle) const {
    if (numInputs >= 2) {
        if (numHigh >= 1) {
            return HIGH;
        } else if (numMiddle >= 1) {
            return MIDDLE;
        }
    }
    return LOW;
}